

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O2

uint16_t __thiscall libtorrent::aux::session_impl::session_time(session_impl *this)

{
  uint16_t uVar1;
  time_point tVar2;
  long lVar3;
  
  tVar2 = time_now();
  lVar3 = (long)tVar2.__d.__r - (this->m_created).__d.__r;
  uVar1 = (short)(lVar3 / 1000000000) + 1;
  if (0x3b9a8e6535ff < lVar3) {
    uVar1 = 0xffff;
  }
  return uVar1;
}

Assistant:

std::uint16_t session_time() const override
			{
				// +1 is here to make it possible to distinguish uninitialized (to
				// 0) timestamps and timestamps of things that happened during the
				// first second after the session was constructed
				std::int64_t const ret = total_seconds(aux::time_now()
					- m_created) + 1;
				TORRENT_ASSERT(ret >= 0);
				if (ret > (std::numeric_limits<std::uint16_t>::max)())
					return (std::numeric_limits<std::uint16_t>::max)();
				return static_cast<std::uint16_t>(ret);
			}